

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

ListSegment *
duckdb::CreateStructSegment
          (ListSegmentFunctions *functions,ArenaAllocator *allocator,uint16_t capacity)

{
  ListSegment *pLVar1;
  const_reference pvVar2;
  ListSegment *pLVar3;
  undefined6 in_register_00000012;
  ulong __n;
  ulong uVar4;
  value_type child_function;
  
  uVar4 = CONCAT62(in_register_00000012,capacity) & 0xffffffff;
  pLVar1 = (ListSegment *)
           ArenaAllocator::Allocate
                     (allocator,
                      uVar4 + (((long)(functions->child_functions).
                                      super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                      .
                                      super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(functions->child_functions).
                                     super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                     .
                                     super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x38) * 8 + 0x17 &
                      0xfffffffffffffff8);
  pLVar1->capacity = capacity;
  pLVar1->count = 0;
  pLVar1->next = (ListSegment *)0x0;
  for (__n = 0; __n < (ulong)(((long)(functions->child_functions).
                                     super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                     .
                                     super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(functions->child_functions).
                                    super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                    .
                                    super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      __n = __n + 1) {
    pvVar2 = vector<duckdb::ListSegmentFunctions,_true>::get<true>(&functions->child_functions,__n);
    ListSegmentFunctions::ListSegmentFunctions(&child_function,pvVar2);
    pLVar3 = (*child_function.create_segment)(&child_function,allocator,capacity);
    *(ListSegment **)((long)&pLVar1[1].count + __n * 8 + uVar4) = pLVar3;
    ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
    ~vector(&child_function.child_functions.
             super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
           );
  }
  return pLVar1;
}

Assistant:

static ListSegment *CreateStructSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                                        uint16_t capacity) {
	// allocate data and set header
	auto segment =
	    reinterpret_cast<ListSegment *>(AllocateStructData(allocator, capacity, functions.child_functions.size()));
	segment->capacity = capacity;
	segment->count = 0;
	segment->next = nullptr;

	// create a child ListSegment with exactly the same capacity for each child vector
	auto child_segments = GetStructData(segment);
	for (idx_t i = 0; i < functions.child_functions.size(); i++) {
		auto child_function = functions.child_functions[i];
		auto child_segment = child_function.create_segment(child_function, allocator, capacity);
		Store<ListSegment *>(child_segment, data_ptr_cast(child_segments + i));
	}

	return segment;
}